

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::FocusFrontMostActiveWindow(ImGuiWindow *ignore_window)

{
  value_type *ppIVar1;
  ImVector<ImGuiWindow_*> *this;
  int i;
  ImGuiWindow *window;
  
  i = (GImGui->Windows).Size;
  this = &GImGui->Windows;
  do {
    do {
      do {
        if (i < 1) {
          return;
        }
        i = i + -1;
        ppIVar1 = ImVector<ImGuiWindow_*>::operator[](this,i);
      } while (*ppIVar1 == ignore_window);
      ppIVar1 = ImVector<ImGuiWindow_*>::operator[](this,i);
    } while ((*ppIVar1)->WasActive != true);
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](this,i);
  } while (((*ppIVar1)->Flags & 0x1000000) != 0);
  ppIVar1 = ImVector<ImGuiWindow_*>::operator[](this,i);
  window = (*ppIVar1)->NavLastChildNavWindow;
  if (window == (ImGuiWindow *)0x0) {
    window = *ppIVar1;
  }
  FocusWindow(window);
  return;
}

Assistant:

void ImGui::FocusFrontMostActiveWindow(ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.Windows.Size - 1; i >= 0; i--)
        if (g.Windows[i] != ignore_window && g.Windows[i]->WasActive && !(g.Windows[i]->Flags & ImGuiWindowFlags_ChildWindow))
        {
            ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(g.Windows[i]); 
            FocusWindow(focus_window);
            return;
        }
}